

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined4 uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined4 uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined4 uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  
  fVar18 = scale * r_scale0;
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar28 = sVar8 * uVar5;
  lVar31 = sVar8 * (uVar5 + 1);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar9 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar29 = uVar5 * sVar8;
  lVar30 = sVar8 * (uVar5 + 1);
  auVar73 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar28),(undefined1  [16])ofs->field_0);
  auVar43._0_4_ = scale * auVar73._0_4_;
  auVar43._4_4_ = scale * auVar73._4_4_;
  auVar43._8_4_ = scale * auVar73._8_4_;
  auVar43._12_4_ = scale * auVar73._12_4_;
  auVar41._4_4_ = auVar43._0_4_;
  auVar41._0_4_ = auVar43._0_4_;
  auVar41._8_4_ = auVar43._0_4_;
  auVar41._12_4_ = auVar43._0_4_;
  auVar73 = vshufps_avx(auVar43,auVar43,0x55);
  aVar3 = (space->vx).field_0;
  aVar4 = (space->vy).field_0;
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar24 = (space->vz).field_0.m128[0];
  fVar25 = (space->vz).field_0.m128[1];
  fVar26 = (space->vz).field_0.m128[2];
  fVar27 = (space->vz).field_0.m128[3];
  auVar38._0_4_ = fVar24 * auVar43._0_4_;
  auVar38._4_4_ = fVar25 * auVar43._4_4_;
  auVar38._8_4_ = fVar26 * auVar43._8_4_;
  auVar38._12_4_ = fVar27 * auVar43._12_4_;
  auVar73 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar4,auVar73);
  auVar38 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar3,auVar41);
  fVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar19 = fVar18 * fVar2 * *(float *)(pcVar7 + lVar28 + 0xc);
  auVar73 = vinsertps_avx(auVar38,ZEXT416((uint)fVar19),0x30);
  auVar43 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar31),(undefined1  [16])ofs->field_0);
  auVar39._0_4_ = scale * auVar43._0_4_;
  auVar39._4_4_ = scale * auVar43._4_4_;
  auVar39._8_4_ = scale * auVar43._8_4_;
  auVar39._12_4_ = scale * auVar43._12_4_;
  auVar42._4_4_ = auVar39._0_4_;
  auVar42._0_4_ = auVar39._0_4_;
  auVar42._8_4_ = auVar39._0_4_;
  auVar42._12_4_ = auVar39._0_4_;
  auVar43 = vshufps_avx(auVar39,auVar39,0x55);
  auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
  auVar37._0_4_ = fVar24 * auVar39._0_4_;
  auVar37._4_4_ = fVar25 * auVar39._4_4_;
  auVar37._8_4_ = fVar26 * auVar39._8_4_;
  auVar37._12_4_ = fVar27 * auVar39._12_4_;
  auVar43 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar43);
  auVar37 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar3,auVar42);
  fVar20 = fVar18 * fVar2 * *(float *)(pcVar7 + lVar31 + 0xc);
  auVar43 = vinsertps_avx(auVar37,ZEXT416((uint)fVar20),0x30);
  pfVar1 = (float *)(pcVar9 + lVar29);
  auVar40._0_4_ = scale * *pfVar1;
  auVar40._4_4_ = scale * pfVar1[1];
  auVar40._8_4_ = scale * pfVar1[2];
  auVar40._12_4_ = scale * pfVar1[3];
  auVar86._4_4_ = auVar40._0_4_;
  auVar86._0_4_ = auVar40._0_4_;
  auVar86._8_4_ = auVar40._0_4_;
  auVar86._12_4_ = auVar40._0_4_;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  auVar41 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar32._0_4_ = fVar24 * auVar41._0_4_;
  auVar32._4_4_ = fVar25 * auVar41._4_4_;
  auVar32._8_4_ = fVar26 * auVar41._8_4_;
  auVar32._12_4_ = fVar27 * auVar41._12_4_;
  auVar39 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar4,auVar39);
  auVar39 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar86);
  auVar39 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar2 * *(float *)(pcVar9 + lVar29 + 0xc) * fVar18)
                                         ),0x30);
  pfVar1 = (float *)(pcVar9 + lVar30);
  auVar33._0_4_ = scale * *pfVar1;
  auVar33._4_4_ = scale * pfVar1[1];
  auVar33._8_4_ = scale * pfVar1[2];
  auVar33._12_4_ = scale * pfVar1[3];
  auVar36._4_4_ = auVar33._0_4_;
  auVar36._0_4_ = auVar33._0_4_;
  auVar36._8_4_ = auVar33._0_4_;
  auVar36._12_4_ = auVar33._0_4_;
  auVar41 = vshufps_avx(auVar33,auVar33,0x55);
  auVar42 = vshufps_avx(auVar33,auVar33,0xaa);
  auVar34._0_4_ = fVar24 * auVar42._0_4_;
  auVar34._4_4_ = fVar25 * auVar42._4_4_;
  auVar34._8_4_ = fVar26 * auVar42._8_4_;
  auVar34._12_4_ = fVar27 * auVar42._12_4_;
  auVar41 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar4,auVar41);
  auVar41 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar36);
  auVar41 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar18 * fVar2 * *(float *)(pcVar9 + lVar30 + 0xc))
                                         ),0x30);
  auVar35._8_4_ = 0xbeaaaaab;
  auVar35._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar35._12_4_ = 0xbeaaaaab;
  auVar39 = vfnmadd213ps_fma(auVar39,auVar35,auVar73);
  auVar73 = vfmadd213ps_fma(auVar41,auVar35,auVar43);
  lVar28 = (long)(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.tessellationRate;
  uVar81 = auVar38._0_4_;
  uVar87 = auVar39._0_4_;
  uVar74 = auVar73._0_4_;
  if (lVar28 == 4) {
    auVar78._4_4_ = uVar81;
    auVar78._0_4_ = uVar81;
    auVar78._8_4_ = uVar81;
    auVar78._12_4_ = uVar81;
    auVar41 = vshufps_avx(auVar38,auVar38,0x55);
    auVar42 = vshufps_avx(auVar38,auVar38,0xaa);
    auVar82._4_4_ = fVar19;
    auVar82._0_4_ = fVar19;
    auVar82._8_4_ = fVar19;
    auVar82._12_4_ = fVar19;
    auVar83._4_4_ = uVar87;
    auVar83._0_4_ = uVar87;
    auVar83._8_4_ = uVar87;
    auVar83._12_4_ = uVar87;
    auVar38 = vshufps_avx(auVar39,auVar39,0x55);
    auVar40 = vshufps_avx(auVar39,auVar39,0xaa);
    auVar39 = vshufps_avx(auVar39,auVar39,0xff);
    auVar88._4_4_ = uVar74;
    auVar88._0_4_ = uVar74;
    auVar88._8_4_ = uVar74;
    auVar88._12_4_ = uVar74;
    auVar32 = vshufps_avx512vl(auVar73,auVar73,0x55);
    auVar33 = vshufps_avx512vl(auVar73,auVar73,0xaa);
    auVar73 = vshufps_avx(auVar73,auVar73,0xff);
    auVar34 = vbroadcastss_avx512vl(auVar37);
    auVar35 = vshufps_avx512vl(auVar37,auVar37,0x55);
    auVar37 = vshufps_avx(auVar37,auVar37,0xaa);
    auVar36 = vbroadcastss_avx512vl(ZEXT416((uint)fVar20));
    auVar34 = vmulps_avx512vl(auVar34,bezier_basis0._3740_16_);
    auVar35 = vmulps_avx512vl(auVar35,bezier_basis0._3740_16_);
    auVar37 = vmulps_avx512vl(auVar37,bezier_basis0._3740_16_);
    auVar36 = vmulps_avx512vl(auVar36,bezier_basis0._3740_16_);
    auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._2584_16_,auVar88);
    auVar32 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2584_16_,auVar32);
    auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._2584_16_,auVar33);
    auVar33 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._2584_16_,auVar73);
    auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._1428_16_,auVar83);
    auVar38 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._1428_16_,auVar38);
    auVar73 = vfmadd231ps_fma(auVar37,bezier_basis0._1428_16_,auVar40);
    auVar39 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._1428_16_,auVar39);
    auVar37 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._272_16_,auVar78);
    auVar40 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._272_16_,auVar41);
    auVar38 = vfmadd231ps_fma(auVar73,bezier_basis0._272_16_,auVar42);
    auVar32 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._272_16_,auVar82);
    auVar33 = vshufps_avx512vl(auVar37,auVar37,0xb1);
    auVar39 = vminps_avx512vl(auVar33,auVar37);
    auVar73 = vshufpd_avx(auVar39,auVar39,1);
    auVar73 = vminps_avx(auVar73,auVar39);
    auVar34 = vshufps_avx512vl(auVar40,auVar40,0xb1);
    auVar41 = vminps_avx512vl(auVar34,auVar40);
    auVar39 = vshufpd_avx(auVar41,auVar41,1);
    auVar39 = vminps_avx(auVar39,auVar41);
    auVar73 = vinsertps_avx(auVar73,auVar39,0x1c);
    auVar42 = vshufps_avx(auVar38,auVar38,0xb1);
    auVar39 = vminps_avx(auVar42,auVar38);
    auVar41 = vshufpd_avx(auVar39,auVar39,1);
    auVar39 = vminps_avx(auVar41,auVar39);
    auVar73 = vinsertps_avx(auVar73,auVar39,0x20);
    auVar41 = vmaxps_avx512vl(auVar33,auVar37);
    auVar39 = vshufpd_avx(auVar41,auVar41,1);
    auVar39 = vmaxps_avx(auVar39,auVar41);
    auVar37 = vmaxps_avx512vl(auVar34,auVar40);
    auVar41 = vshufpd_avx(auVar37,auVar37,1);
    auVar41 = vmaxps_avx(auVar41,auVar37);
    auVar39 = vinsertps_avx(auVar39,auVar41,0x1c);
    auVar41 = vmaxps_avx(auVar42,auVar38);
    auVar42 = vshufpd_avx(auVar41,auVar41,1);
    auVar41 = vmaxps_avx(auVar42,auVar41);
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar42 = vandps_avx512vl(auVar32,auVar22);
    auVar39 = vinsertps_avx(auVar39,auVar41,0x20);
    auVar41 = vprolq_avx512vl(auVar42,0x20);
    auVar41 = vmaxps_avx(auVar41,auVar42);
    uVar74 = auVar41._0_4_;
    auVar79._4_4_ = uVar74;
    auVar79._0_4_ = uVar74;
    auVar79._8_4_ = uVar74;
    auVar79._12_4_ = uVar74;
    auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
    auVar75 = vmaxps_avx(auVar41,auVar79);
  }
  else {
    auVar44 = vpbroadcastd_avx512vl();
    auVar80._4_4_ = uVar81;
    auVar80._0_4_ = uVar81;
    auVar80._8_4_ = uVar81;
    auVar80._12_4_ = uVar81;
    auVar80._16_4_ = uVar81;
    auVar80._20_4_ = uVar81;
    auVar80._24_4_ = uVar81;
    auVar80._28_4_ = uVar81;
    auVar45 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar46 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar47 = vpermps_avx512vl(auVar45,ZEXT1632(auVar38));
    auVar48 = vpermps_avx512vl(auVar46,ZEXT1632(auVar38));
    auVar84._4_4_ = fVar19;
    auVar84._0_4_ = fVar19;
    auVar84._8_4_ = fVar19;
    auVar84._12_4_ = fVar19;
    auVar84._16_4_ = fVar19;
    auVar84._20_4_ = fVar19;
    auVar84._24_4_ = fVar19;
    auVar84._28_4_ = fVar19;
    auVar85._4_4_ = uVar87;
    auVar85._0_4_ = uVar87;
    auVar85._8_4_ = uVar87;
    auVar85._12_4_ = uVar87;
    auVar85._16_4_ = uVar87;
    auVar85._20_4_ = uVar87;
    auVar85._24_4_ = uVar87;
    auVar85._28_4_ = uVar87;
    auVar67 = ZEXT1632(auVar39);
    auVar49 = vpermps_avx512vl(auVar45,auVar67);
    auVar50 = vpermps_avx512vl(auVar46,auVar67);
    auVar69._8_4_ = 3;
    auVar69._0_8_ = 0x300000003;
    auVar69._12_4_ = 3;
    auVar69._16_4_ = 3;
    auVar69._20_4_ = 3;
    auVar69._24_4_ = 3;
    auVar69._28_4_ = 3;
    auVar67 = vpermps_avx2(auVar69,auVar67);
    auVar89._4_4_ = uVar74;
    auVar89._0_4_ = uVar74;
    auVar89._8_4_ = uVar74;
    auVar89._12_4_ = uVar74;
    auVar89._16_4_ = uVar74;
    auVar89._20_4_ = uVar74;
    auVar89._24_4_ = uVar74;
    auVar89._28_4_ = uVar74;
    auVar66 = ZEXT1632(auVar73);
    auVar51 = vpermps_avx512vl(auVar45,auVar66);
    auVar52 = vpermps_avx512vl(auVar46,auVar66);
    auVar53 = vpermps_avx512vl(auVar69,auVar66);
    auVar54 = vbroadcastss_avx512vl(auVar37);
    auVar55 = vpermps_avx512vl(auVar45,ZEXT1632(auVar37));
    auVar56 = vpermps_avx512vl(auVar46,ZEXT1632(auVar37));
    auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)fVar20));
    lVar29 = lVar28 * 0x44;
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar45._8_4_ = 0xff800000;
    auVar45._0_8_ = 0xff800000ff800000;
    auVar45._12_4_ = 0xff800000;
    auVar45._16_4_ = 0xff800000;
    auVar45._20_4_ = 0xff800000;
    auVar45._24_4_ = 0xff800000;
    auVar45._28_4_ = 0xff800000;
    auVar77 = ZEXT864(0) << 0x20;
    lVar30 = 0;
    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar46 = auVar45;
    auVar66 = auVar45;
    auVar68 = auVar58;
    auVar69 = auVar58;
    for (; auVar76 = auVar77._0_32_, lVar30 < lVar28; lVar30 = lVar30 + 8) {
      auVar60 = vpbroadcastd_avx512vl();
      auVar61 = vpord_avx512vl(auVar60,_DAT_01fb4ba0);
      auVar60 = *(undefined1 (*) [32])(lVar29 + 0x21fbbec + lVar30 * 4);
      auVar64 = *(undefined1 (*) [32])(lVar29 + 0x21fc070 + lVar30 * 4);
      uVar21 = vpcmpgtd_avx512vl(auVar44,auVar61);
      auVar61 = vmulps_avx512vl(auVar54,auVar64);
      auVar62 = vmulps_avx512vl(auVar55,auVar64);
      auVar63 = vmulps_avx512vl(auVar56,auVar64);
      auVar64 = vmulps_avx512vl(auVar57,auVar64);
      auVar61 = vfmadd231ps_avx512vl(auVar61,auVar60,auVar89);
      auVar62 = vfmadd231ps_avx512vl(auVar62,auVar60,auVar51);
      auVar63 = vfmadd231ps_avx512vl(auVar63,auVar60,auVar52);
      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar53,auVar60);
      auVar60 = *(undefined1 (*) [32])(lVar29 + 0x21fb768 + lVar30 * 4);
      auVar61 = vfmadd231ps_avx512vl(auVar61,auVar60,auVar85);
      auVar62 = vfmadd231ps_avx512vl(auVar62,auVar60,auVar49);
      auVar63 = vfmadd231ps_avx512vl(auVar63,auVar60,auVar50);
      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar67,auVar60);
      auVar60 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 * 4 + lVar29);
      auVar61 = vfmadd231ps_avx512vl(auVar61,auVar60,auVar80);
      auVar62 = vfmadd231ps_avx512vl(auVar62,auVar60,auVar47);
      auVar63 = vfmadd231ps_avx512vl(auVar63,auVar60,auVar48);
      auVar60 = vfmadd231ps_avx512vl(auVar64,auVar84,auVar60);
      auVar65 = vminps_avx512vl(auVar68,auVar61);
      bVar10 = (byte)uVar21;
      auVar64._0_4_ = (uint)(bVar10 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar68._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar64._4_4_ = (uint)bVar11 * auVar65._4_4_ | (uint)!bVar11 * auVar68._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar64._8_4_ = (uint)bVar11 * auVar65._8_4_ | (uint)!bVar11 * auVar68._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar64._12_4_ = (uint)bVar11 * auVar65._12_4_ | (uint)!bVar11 * auVar68._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar64._16_4_ = (uint)bVar11 * auVar65._16_4_ | (uint)!bVar11 * auVar68._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar64._20_4_ = (uint)bVar11 * auVar65._20_4_ | (uint)!bVar11 * auVar68._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar64._24_4_ = (uint)bVar11 * auVar65._24_4_ | (uint)!bVar11 * auVar68._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar64._28_4_ = (uint)bVar11 * auVar65._28_4_ | (uint)!bVar11 * auVar68._28_4_;
      auVar61 = vmaxps_avx512vl(auVar46,auVar61);
      auVar68._0_4_ = (uint)(bVar10 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar46._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar68._4_4_ = (uint)bVar11 * auVar61._4_4_ | (uint)!bVar11 * auVar46._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar68._8_4_ = (uint)bVar11 * auVar61._8_4_ | (uint)!bVar11 * auVar46._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar68._12_4_ = (uint)bVar11 * auVar61._12_4_ | (uint)!bVar11 * auVar46._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar68._16_4_ = (uint)bVar11 * auVar61._16_4_ | (uint)!bVar11 * auVar46._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar68._20_4_ = (uint)bVar11 * auVar61._20_4_ | (uint)!bVar11 * auVar46._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar68._24_4_ = (uint)bVar11 * auVar61._24_4_ | (uint)!bVar11 * auVar46._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar68._28_4_ = (uint)bVar11 * auVar61._28_4_ | (uint)!bVar11 * auVar46._28_4_;
      auVar46 = vminps_avx512vl(auVar69,auVar62);
      auVar61._0_4_ = (uint)(bVar10 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar69._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar61._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * auVar69._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar61._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * auVar69._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar61._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * auVar69._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar61._16_4_ = (uint)bVar11 * auVar46._16_4_ | (uint)!bVar11 * auVar69._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar61._20_4_ = (uint)bVar11 * auVar46._20_4_ | (uint)!bVar11 * auVar69._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar61._24_4_ = (uint)bVar11 * auVar46._24_4_ | (uint)!bVar11 * auVar69._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar61._28_4_ = (uint)bVar11 * auVar46._28_4_ | (uint)!bVar11 * auVar69._28_4_;
      auVar46 = vmaxps_avx512vl(auVar66,auVar62);
      auVar62._0_4_ = (uint)(bVar10 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar66._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar62._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * auVar66._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar62._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * auVar66._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar62._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * auVar66._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar62._16_4_ = (uint)bVar11 * auVar46._16_4_ | (uint)!bVar11 * auVar66._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar62._20_4_ = (uint)bVar11 * auVar46._20_4_ | (uint)!bVar11 * auVar66._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar62._24_4_ = (uint)bVar11 * auVar46._24_4_ | (uint)!bVar11 * auVar66._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar62._28_4_ = (uint)bVar11 * auVar46._28_4_ | (uint)!bVar11 * auVar66._28_4_;
      auVar46 = vminps_avx512vl(auVar58,auVar63);
      auVar65._0_4_ = (uint)(bVar10 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar58._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar65._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * auVar58._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar65._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * auVar58._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar65._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * auVar58._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar65._16_4_ = (uint)bVar11 * auVar46._16_4_ | (uint)!bVar11 * auVar58._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar65._20_4_ = (uint)bVar11 * auVar46._20_4_ | (uint)!bVar11 * auVar58._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar65._24_4_ = (uint)bVar11 * auVar46._24_4_ | (uint)!bVar11 * auVar58._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar65._28_4_ = (uint)bVar11 * auVar46._28_4_ | (uint)!bVar11 * auVar58._28_4_;
      auVar46 = vmaxps_avx512vl(auVar45,auVar63);
      auVar66._0_4_ = (uint)(bVar10 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar45._0_4_
      ;
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar66._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * auVar45._4_4_;
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar66._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * auVar45._8_4_;
      bVar11 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar66._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * auVar45._12_4_;
      bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar66._16_4_ = (uint)bVar11 * auVar46._16_4_ | (uint)!bVar11 * auVar45._16_4_;
      bVar11 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar66._20_4_ = (uint)bVar11 * auVar46._20_4_ | (uint)!bVar11 * auVar45._20_4_;
      bVar11 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar66._24_4_ = (uint)bVar11 * auVar46._24_4_ | (uint)!bVar11 * auVar45._24_4_;
      bVar11 = SUB81(uVar21 >> 7,0);
      auVar66._28_4_ = (uint)bVar11 * auVar46._28_4_ | (uint)!bVar11 * auVar45._28_4_;
      vandps_avx512vl(auVar60,auVar59);
      auVar45 = vmaxps_avx512vl(auVar76,auVar66);
      bVar11 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar14 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar15 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar16 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar17 = SUB81(uVar21 >> 7,0);
      auVar77 = ZEXT3264(CONCAT428((uint)bVar17 * auVar45._28_4_ | (uint)!bVar17 * auVar77._28_4_,
                                   CONCAT424((uint)bVar16 * auVar45._24_4_ |
                                             (uint)!bVar16 * auVar77._24_4_,
                                             CONCAT420((uint)bVar15 * auVar45._20_4_ |
                                                       (uint)!bVar15 * auVar77._20_4_,
                                                       CONCAT416((uint)bVar14 * auVar45._16_4_ |
                                                                 (uint)!bVar14 * auVar77._16_4_,
                                                                 CONCAT412((uint)bVar13 *
                                                                           auVar45._12_4_ |
                                                                           (uint)!bVar13 *
                                                                           auVar77._12_4_,
                                                                           CONCAT48((uint)bVar12 *
                                                                                    auVar45._8_4_ |
                                                                                    (uint)!bVar12 *
                                                                                    auVar77._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar11 * auVar45._4_4_ |
                                                  (uint)!bVar11 * auVar77._4_4_,
                                                  (uint)(bVar10 & 1) * auVar45._0_4_ |
                                                  (uint)!(bool)(bVar10 & 1) * auVar77._0_4_))))))));
      auVar45 = auVar66;
      auVar46 = auVar68;
      auVar66 = auVar62;
      auVar58 = auVar65;
      auVar68 = auVar64;
      auVar69 = auVar61;
    }
    auVar67 = vshufps_avx512vl(auVar68,auVar68,0xb1);
    auVar68 = vminps_avx512vl(auVar68,auVar67);
    auVar67 = vshufpd_avx(auVar68,auVar68,5);
    auVar67 = vminps_avx(auVar68,auVar67);
    auVar73 = vminps_avx(auVar67._0_16_,auVar67._16_16_);
    auVar67 = vshufps_avx512vl(auVar69,auVar69,0xb1);
    auVar69 = vminps_avx512vl(auVar69,auVar67);
    auVar67 = vshufpd_avx(auVar69,auVar69,5);
    auVar67 = vminps_avx(auVar69,auVar67);
    auVar39 = vminps_avx(auVar67._0_16_,auVar67._16_16_);
    auVar39 = vunpcklps_avx(auVar73,auVar39);
    auVar67 = vshufps_avx512vl(auVar58,auVar58,0xb1);
    auVar69 = vminps_avx512vl(auVar58,auVar67);
    auVar67 = vshufpd_avx(auVar69,auVar69,5);
    auVar67 = vminps_avx(auVar69,auVar67);
    auVar73 = vminps_avx(auVar67._0_16_,auVar67._16_16_);
    auVar73 = vinsertps_avx(auVar39,auVar73,0x28);
    auVar67 = vshufps_avx(auVar46,auVar46,0xb1);
    auVar67 = vmaxps_avx(auVar46,auVar67);
    auVar46 = vshufpd_avx(auVar67,auVar67,5);
    auVar67 = vmaxps_avx(auVar67,auVar46);
    auVar39 = vmaxps_avx(auVar67._0_16_,auVar67._16_16_);
    auVar67 = vshufps_avx(auVar66,auVar66,0xb1);
    auVar67 = vmaxps_avx(auVar66,auVar67);
    auVar46 = vshufpd_avx(auVar67,auVar67,5);
    auVar67 = vmaxps_avx(auVar67,auVar46);
    auVar41 = vmaxps_avx(auVar67._0_16_,auVar67._16_16_);
    auVar41 = vunpcklps_avx(auVar39,auVar41);
    auVar67 = vshufps_avx(auVar45,auVar45,0xb1);
    auVar67 = vmaxps_avx(auVar45,auVar67);
    auVar45 = vshufpd_avx(auVar67,auVar67,5);
    auVar67 = vmaxps_avx(auVar67,auVar45);
    auVar39 = vmaxps_avx(auVar67._0_16_,auVar67._16_16_);
    auVar39 = vinsertps_avx(auVar41,auVar39,0x28);
    auVar67 = vshufps_avx(auVar76,auVar76,0xb1);
    auVar67 = vmaxps_avx(auVar76,auVar67);
    auVar45 = vshufpd_avx(auVar67,auVar67,5);
    auVar67 = vmaxps_avx(auVar67,auVar45);
    auVar41 = vmaxps_avx(auVar67._0_16_,auVar67._16_16_);
    auVar75._0_4_ = auVar41._0_4_;
    auVar75._4_4_ = auVar75._0_4_;
    auVar75._8_4_ = auVar75._0_4_;
    auVar75._12_4_ = auVar75._0_4_;
  }
  auVar41 = vminps_avx(auVar73,auVar43);
  auVar73 = vmaxps_avx(auVar39,auVar43);
  auVar70._4_4_ = fVar20;
  auVar70._0_4_ = fVar20;
  auVar70._8_4_ = fVar20;
  auVar70._12_4_ = fVar20;
  auVar23._8_4_ = 0x7fffffff;
  auVar23._0_8_ = 0x7fffffff7fffffff;
  auVar23._12_4_ = 0x7fffffff;
  auVar43 = vandps_avx512vl(auVar70,auVar23);
  auVar43 = vmaxps_avx(auVar75,auVar43);
  auVar39 = vsubps_avx(auVar41,auVar43);
  auVar71._0_4_ = auVar73._0_4_ + auVar43._0_4_;
  auVar71._4_4_ = auVar73._4_4_ + auVar43._4_4_;
  auVar71._8_4_ = auVar73._8_4_ + auVar43._8_4_;
  auVar71._12_4_ = auVar73._12_4_ + auVar43._12_4_;
  auVar72._8_4_ = 0x7fffffff;
  auVar72._0_8_ = 0x7fffffff7fffffff;
  auVar72._12_4_ = 0x7fffffff;
  auVar73 = vandps_avx(auVar39,auVar72);
  auVar43 = vandps_avx(auVar71,auVar72);
  auVar73 = vmaxps_avx(auVar73,auVar43);
  auVar43 = vmovshdup_avx(auVar73);
  auVar43 = vmaxss_avx(auVar43,auVar73);
  auVar73 = vshufpd_avx(auVar73,auVar73,1);
  auVar73 = vmaxss_avx(auVar73,auVar43);
  fVar2 = auVar73._0_4_ * 4.7683716e-07;
  auVar73._4_4_ = fVar2;
  auVar73._0_4_ = fVar2;
  auVar73._8_4_ = fVar2;
  auVar73._12_4_ = fVar2;
  aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar39,auVar73);
  (__return_storage_ptr__->lower).field_0 = aVar3;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar71._0_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar71._4_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar71._8_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar71._12_4_ + fVar2;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }